

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.cpp
# Opt level: O0

void __thiscall r_exec::Overlay::unpatch_code(Overlay *this,uint16_t patch_index)

{
  ushort uVar1;
  Atom *pAVar2;
  int iVar3;
  Code *pCVar4;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  ushort local_2a;
  uint16_t i;
  Atom *original_code;
  Code *object;
  uint16_t patch_index_local;
  Overlay *this_local;
  
  pCVar4 = get_core_object(this);
  iVar3 = (*(pCVar4->super__Object)._vptr__Object[4])(pCVar4,0);
  local_2a = patch_index;
  while( true ) {
    sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->patch_indices)
    ;
    if (sVar5 <= local_2a) break;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->patch_indices,(ulong)local_2a);
    uVar1 = *pvVar6;
    pAVar2 = this->code;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->patch_indices,(ulong)local_2a);
    r_code::Atom::operator=
              (pAVar2 + (ulong)*pvVar6 * 4,(Atom *)(CONCAT44(extraout_var,iVar3) + (ulong)uVar1 * 4)
              );
    local_2a = local_2a + 1;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->patch_indices,(ulong)patch_index);
  return;
}

Assistant:

void Overlay::unpatch_code(uint16_t patch_index)
{
    Code *object = get_core_object();
    Atom *original_code = &object->code(0);

    for (uint16_t i = patch_index; i < patch_indices.size(); ++i) {
        code[patch_indices[i]] = original_code[patch_indices[i]];
    }

    patch_indices.resize(patch_index);
}